

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O1

void __thiscall
FIX50SP1::MessageCracker::onMessage(MessageCracker *this,SecurityTypes *param_1,SessionID *param_2)

{
  UnsupportedMessageType *this_00;
  string local_40;
  
  this_00 = (UnsupportedMessageType *)__cxa_allocate_exception(0x50);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  FIX::UnsupportedMessageType::UnsupportedMessageType(this_00,&local_40);
  __cxa_throw(this_00,&FIX::UnsupportedMessageType::typeinfo,FIX::Exception::~Exception);
}

Assistant:

virtual void onMessage( const SecurityListRequest&, const FIX::SessionID& ) 
    { throw FIX::UnsupportedMessageType(); }